

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  uint32 first_byte_or_zero;
  uint uVar5;
  int64 iVar6;
  ulong uVar7;
  byte *pbVar8;
  uint8 *puVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  int value;
  ulong unaff_R13;
  bool bVar14;
  
  pbVar13 = input->buffer_;
  if (pbVar13 < input->buffer_end_) {
    uVar12 = (uint)*pbVar13;
    if (-1 < (char)*pbVar13) {
      input->buffer_ = pbVar13 + 1;
      bVar14 = true;
      goto LAB_00308712;
    }
  }
  else {
    uVar12 = 0;
  }
  iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar12);
  uVar12 = (uint)iVar6;
  bVar14 = -1 < iVar6;
LAB_00308712:
  if (bVar14) {
    limit = io::CodedInputStream::PushLimit(input,uVar12);
    uVar12 = field_number << 3;
    do {
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar4 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar13 = input->buffer_;
      if (pbVar13 < input->buffer_end_) {
        bVar1 = *pbVar13;
        uVar7 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00308769;
        input->buffer_ = pbVar13 + 1;
        bVar14 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_00308769:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar14 = -1 < (long)uVar7;
      }
      uVar2 = unaff_R13;
      if (bVar14) {
        uVar2 = uVar7;
      }
      unaff_R13 = uVar2 & 0xffffffff;
      if (!bVar14) {
        return false;
      }
      uVar10 = (uint)uVar2;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)(uVar10), bVar3)) {
        if (values->current_size_ == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        iVar4 = values->current_size_;
        values->current_size_ = iVar4 + 1;
        *(uint *)((long)values->arena_or_elements_ + (long)iVar4 * 4) = uVar10;
      }
      else {
        if ((unknown_fields_stream->impl_).end_ <= unknown_fields_stream->cur_) {
          puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,unknown_fields_stream->cur_);
          unknown_fields_stream->cur_ = puVar9;
        }
        pbVar13 = unknown_fields_stream->cur_;
        if (uVar12 < 0x80) {
          *pbVar13 = (byte)uVar12;
          pbVar13 = pbVar13 + 1;
        }
        else {
          *pbVar13 = (byte)uVar12 | 0x80;
          if (uVar12 < 0x4000) {
            pbVar13[1] = (byte)(uVar12 >> 7);
            pbVar13 = pbVar13 + 2;
          }
          else {
            pbVar13 = pbVar13 + 2;
            uVar11 = uVar12 >> 7;
            do {
              pbVar8 = pbVar13;
              pbVar8[-1] = (byte)uVar11 | 0x80;
              uVar5 = uVar11 >> 7;
              pbVar13 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar5;
            } while (bVar3);
            *pbVar8 = (byte)uVar5;
          }
        }
        unknown_fields_stream->cur_ = pbVar13;
        if ((unknown_fields_stream->impl_).end_ <= pbVar13) {
          puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar13);
          unknown_fields_stream->cur_ = puVar9;
        }
        pbVar13 = unknown_fields_stream->cur_;
        if (uVar10 < 0x80) {
          *pbVar13 = (byte)unaff_R13;
          pbVar13 = pbVar13 + 1;
        }
        else {
          *pbVar13 = (byte)unaff_R13 | 0x80;
          uVar7 = unaff_R13 >> 7;
          if (uVar10 < 0x4000) {
            pbVar13[1] = (byte)uVar7;
            pbVar13 = pbVar13 + 2;
          }
          else {
            pbVar13 = pbVar13 + 2;
            do {
              pbVar8 = pbVar13;
              uVar10 = (uint)uVar7;
              pbVar8[-1] = (byte)uVar7 | 0x80;
              uVar11 = uVar10 >> 7;
              uVar7 = (ulong)uVar11;
              pbVar13 = pbVar8 + 1;
            } while (0x3fff < uVar10);
            *pbVar8 = (byte)uVar11;
          }
        }
        unknown_fields_stream->cur_ = pbVar13;
      }
    } while (bVar14);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}